

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O3

int xmlParse3986URIReference(xmlURIPtr uri,char *str)

{
  int iVar1;
  int iVar2;
  xmlChar *pxVar3;
  byte bVar4;
  uint uVar5;
  byte *pbVar6;
  long lVar7;
  byte *local_50;
  byte *local_48;
  byte *local_40;
  byte *local_38;
  
  if (str == (char *)0x0) {
    return -1;
  }
  xmlCleanURI(uri);
  if ((byte)((*str & 0xdfU) + 0xbf) < 0x1a) {
    lVar7 = 0;
    while (((bVar4 = str[lVar7 + 1], (byte)(bVar4 - 0x30) < 10 ||
            ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a)) ||
           ((bVar4 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar4 & 0x3f) & 1) != 0))))) {
      lVar7 = lVar7 + 1;
    }
    if (uri != (xmlURIPtr)0x0) {
      if (uri->scheme != (char *)0x0) {
        (*xmlFree)(uri->scheme);
      }
      pxVar3 = xmlStrndup((xmlChar *)str,(int)lVar7 + 1);
      uri->scheme = (char *)pxVar3;
      if (pxVar3 == (xmlChar *)0x0) {
        return -1;
      }
      bVar4 = str[lVar7 + 1];
    }
    if (bVar4 != 0x3a) goto LAB_001508e2;
    pbVar6 = (byte *)(str + lVar7 + 2);
    bVar4 = *pbVar6;
    local_50 = pbVar6;
    if (bVar4 == 0x2f) {
      if (str[lVar7 + 3] == '/') {
        local_50 = (byte *)(str + lVar7 + 4);
        iVar1 = xmlParse3986Authority(uri,(char **)&local_50);
        if (iVar1 != 0) goto LAB_001508da;
        if ((uri->server == (char *)0x0) && (uri->port == 0)) {
          uri->port = -1;
        }
        iVar1 = xmlParse3986PathAbEmpty(uri,(char **)&local_50);
      }
      else {
        iVar1 = xmlParse3986PathAbsolute(uri,(char **)&local_50);
      }
      pbVar6 = local_50;
      if (iVar1 != 0) {
LAB_001508da:
        if (iVar1 < 0) {
          return iVar1;
        }
        goto LAB_001508e2;
      }
    }
    else {
      iVar1 = xmlIsUnreserved(uri,(char *)pbVar6);
      if ((iVar1 != 0) ||
         ((uVar5 = bVar4 - 0x21, uVar5 < 0x20 &&
          (((0x96000fe9U >> (uVar5 & 0x1f) & 1) != 0 ||
           (((uVar5 == 4 &&
             (((byte)(str[lVar7 + 3] - 0x30U) < 10 ||
              ((uVar5 = (byte)str[lVar7 + 3] - 0x41, uVar5 < 0x26 &&
               ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) != 0)))))) &&
            (((byte)(str[lVar7 + 4] - 0x30U) < 10 ||
             ((uVar5 = (byte)str[lVar7 + 4] - 0x41, uVar5 < 0x26 &&
              ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) != 0)))))))))))) {
        local_48 = pbVar6;
        local_38 = pbVar6;
        iVar2 = xmlParse3986Segment(uri,(char **)&local_48,'\0',0);
        iVar1 = 1;
        if (iVar2 == 0) {
          do {
            pbVar6 = local_48;
            if (*local_48 != 0x2f) {
              if (uri == (xmlURIPtr)0x0) goto LAB_00150c32;
              if (uri->path != (char *)0x0) {
                (*xmlFree)(uri->path);
              }
              if (local_38 == pbVar6) {
                uri->path = (char *)0x0;
                goto LAB_00150c32;
              }
              iVar1 = ((-2 - (int)str) + (int)pbVar6) - (int)lVar7;
              if ((uri->cleanup & 2) == 0) {
                pxVar3 = (xmlChar *)xmlURIUnescapeString((char *)local_38,iVar1,(char *)0x0);
              }
              else {
                pxVar3 = xmlStrndup(local_38,iVar1);
              }
              uri->path = (char *)pxVar3;
              if (pxVar3 != (xmlChar *)0x0) goto LAB_00150c32;
              iVar1 = -1;
              break;
            }
            local_48 = local_48 + 1;
            iVar1 = 1;
            iVar2 = xmlParse3986Segment(uri,(char **)&local_48,'\0',1);
          } while (iVar2 == 0);
        }
        goto LAB_001508da;
      }
      if (uri != (xmlURIPtr)0x0) {
        if (uri->path != (char *)0x0) {
          (*xmlFree)(uri->path);
        }
        uri->path = (char *)0x0;
      }
    }
LAB_00150c32:
    bVar4 = *pbVar6;
    if (bVar4 == 0x3f) {
      local_40 = pbVar6 + 1;
      iVar1 = xmlParse3986Query(uri,(char **)&local_40);
      if (iVar1 != 0) {
        return -1;
      }
      bVar4 = *local_40;
      pbVar6 = local_40;
    }
    if (bVar4 == 0x23) {
      local_40 = pbVar6 + 1;
      iVar1 = xmlParse3986Fragment(uri,(char **)&local_40);
      if (iVar1 != 0) {
        return -1;
      }
      bVar4 = *local_40;
    }
    if (bVar4 != 0) {
      xmlCleanURI(uri);
      goto LAB_001508e2;
    }
LAB_00150c95:
    iVar1 = 0;
  }
  else {
LAB_001508e2:
    xmlCleanURI(uri);
    bVar4 = *str;
    local_50 = (byte *)str;
    if (bVar4 == 0x2f) {
      if (str[1] == '/') {
        local_50 = (byte *)(str + 2);
        iVar1 = xmlParse3986Authority(uri,(char **)&local_50);
        if (iVar1 != 0) goto LAB_00150b75;
        iVar1 = xmlParse3986PathAbEmpty(uri,(char **)&local_50);
      }
      else {
        iVar1 = xmlParse3986PathAbsolute(uri,(char **)&local_50);
      }
      if (iVar1 == 0) {
LAB_00150b09:
        bVar4 = *local_50;
        if (bVar4 == 0x3f) {
          local_50 = local_50 + 1;
          iVar2 = xmlParse3986Query(uri,(char **)&local_50);
          iVar1 = -1;
          if (iVar2 != 0) goto LAB_00150b75;
          bVar4 = *local_50;
        }
        if (bVar4 == 0x23) {
          local_50 = local_50 + 1;
          iVar2 = xmlParse3986Fragment(uri,(char **)&local_50);
          iVar1 = -1;
          if (iVar2 != 0) goto LAB_00150b75;
          bVar4 = *local_50;
        }
        if (bVar4 == 0) goto LAB_00150c95;
        xmlCleanURI(uri);
        iVar1 = 1;
      }
    }
    else {
      iVar1 = xmlIsUnreserved(uri,str);
      if ((iVar1 == 0) &&
         ((uVar5 = bVar4 - 0x21, 0x1f < uVar5 ||
          (((0x96000fe9U >> (uVar5 & 0x1f) & 1) == 0 &&
           (((uVar5 != 4 ||
             ((9 < (byte)(str[1] - 0x30U) &&
              ((uVar5 = (byte)str[1] - 0x41, 0x25 < uVar5 ||
               ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) == 0)))))) ||
            ((9 < (byte)(str[2] - 0x30U) &&
             ((uVar5 = (byte)str[2] - 0x41, 0x25 < uVar5 ||
              ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) == 0)))))))))))) {
        if (uri != (xmlURIPtr)0x0) {
          if (uri->path != (char *)0x0) {
            (*xmlFree)(uri->path);
          }
          uri->path = (char *)0x0;
        }
        goto LAB_00150b09;
      }
      local_48 = (byte *)str;
      iVar2 = xmlParse3986Segment(uri,(char **)&local_48,':',0);
      iVar1 = 1;
      if (iVar2 == 0) {
        do {
          pbVar6 = local_48;
          if (*local_48 != 0x2f) {
            if (uri != (xmlURIPtr)0x0) {
              if (uri->path != (char *)0x0) {
                (*xmlFree)(uri->path);
              }
              if (pbVar6 == (byte *)str) {
                uri->path = (char *)0x0;
              }
              else {
                iVar1 = (int)pbVar6 - (int)str;
                if ((uri->cleanup & 2) == 0) {
                  pxVar3 = (xmlChar *)xmlURIUnescapeString(str,iVar1,(char *)0x0);
                }
                else {
                  pxVar3 = xmlStrndup((xmlChar *)str,iVar1);
                }
                uri->path = (char *)pxVar3;
                if (pxVar3 == (xmlChar *)0x0) {
                  iVar1 = -1;
                  break;
                }
              }
            }
            local_50 = pbVar6;
            goto LAB_00150b09;
          }
          local_48 = local_48 + 1;
          iVar2 = xmlParse3986Segment(uri,(char **)&local_48,'\0',1);
        } while (iVar2 == 0);
      }
    }
LAB_00150b75:
    xmlCleanURI(uri);
  }
  return iVar1;
}

Assistant:

static int
xmlParse3986URIReference(xmlURIPtr uri, const char *str) {
    int ret;

    if (str == NULL)
	return(-1);
    xmlCleanURI(uri);

    /*
     * Try first to parse absolute refs, then fallback to relative if
     * it fails.
     */
    ret = xmlParse3986URI(uri, str);
    if (ret < 0)
        return(ret);
    if (ret != 0) {
	xmlCleanURI(uri);
        ret = xmlParse3986RelativeRef(uri, str);
	if (ret != 0) {
	    xmlCleanURI(uri);
	    return(ret);
	}
    }
    return(0);
}